

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

void __thiscall Imf_3_2::Image::renameChannel(Image *this,string *oldName,string *newName)

{
  _Rb_tree_color _Var1;
  undefined4 uVar2;
  __type _Var3;
  bool bVar4;
  ostream *poVar5;
  ArgExc *pAVar6;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  *this_00;
  long lVar7;
  ImageLevel **ppIVar8;
  pointer ppVar9;
  mapped_type *pmVar10;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  int x;
  int y;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  iterator oldChannel;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  *in_stack_fffffffffffffbc8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
  *in_stack_fffffffffffffbd0;
  iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf0;
  int local_360;
  int local_35c;
  stringstream local_358 [16];
  ostream local_348 [376];
  _Self local_1d0;
  _Self local_1c8 [3];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  _Self local_28;
  _Self local_20;
  string *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  _Var3 = std::operator==(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  if (!_Var3) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
         ::find(in_stack_fffffffffffffbc8,(key_type *)0x133168);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
         ::end(in_stack_fffffffffffffbc8);
    bVar4 = std::operator==(&local_20,&local_28);
    if (bVar4) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1b0);
      poVar5 = std::operator<<(local_1a0,"Cannot rename image channel ");
      poVar5 = std::operator<<(poVar5,local_10);
      poVar5 = std::operator<<(poVar5," to ");
      poVar5 = std::operator<<(poVar5,local_18);
      poVar5 = std::operator<<(poVar5,".  The image does not have a channel called ");
      poVar5 = std::operator<<(poVar5,local_10);
      std::operator<<(poVar5,".");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar6,local_1b0);
      __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    local_1c8[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
         ::find(in_stack_fffffffffffffbc8,(key_type *)0x133331);
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
         ::end(in_stack_fffffffffffffbc8);
    bVar4 = std::operator!=(local_1c8,&local_1d0);
    if (bVar4) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_358);
      poVar5 = std::operator<<(local_348,"Cannot rename image channel ");
      poVar5 = std::operator<<(poVar5,local_10);
      poVar5 = std::operator<<(poVar5," to ");
      poVar5 = std::operator<<(poVar5,local_18);
      poVar5 = std::operator<<(poVar5,".  The image already has a channel called ");
      poVar5 = std::operator<<(poVar5,local_18);
      std::operator<<(poVar5,".");
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc(pAVar6,local_358);
      __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    local_35c = 0;
    while( true ) {
      __k = (key_type *)(long)local_35c;
      this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
                 *)Array2D<Imf_3_2::ImageLevel_*>::height
                             ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50));
      if ((long)this_00 <= (long)__k) break;
      for (local_360 = 0;
          lVar7 = Array2D<Imf_3_2::ImageLevel_*>::width
                            ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50)), local_360 < lVar7;
          local_360 = local_360 + 1) {
        ppIVar8 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                            ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)local_35c);
        if (ppIVar8[local_360] != (ImageLevel *)0x0) {
          ppIVar8 = Array2D<Imf_3_2::ImageLevel_*>::operator[]
                              ((Array2D<Imf_3_2::ImageLevel_*> *)(in_RDI + 0x50),(long)local_35c);
          (*ppIVar8[local_360]->_vptr_ImageLevel[7])(ppIVar8[local_360],local_10,local_18);
        }
      }
      local_35c = local_35c + 1;
    }
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>
                           *)0x13365c);
    __position._M_node = (_Base_ptr)&ppVar9->second;
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_3_2::Image::ChannelInfo>_>_>
              ::operator[](this_00,__k);
    _Var1 = (__position._M_node)->_M_color;
    uVar2 = *(undefined4 *)&(__position._M_node)->field_0x4;
    *(undefined8 *)((long)&pmVar10->xSampling + 1) = *(undefined8 *)&(__position._M_node)->field_0x5
    ;
    pmVar10->type = _Var1;
    pmVar10->xSampling = uVar2;
    std::
    map<std::__cxx11::string,Imf_3_2::Image::ChannelInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Imf_3_2::Image::ChannelInfo>>>
    ::erase_abi_cxx11_(in_stack_fffffffffffffbd0,__position);
  }
  return;
}

Assistant:

void
Image::renameChannel (const string& oldName, const string& newName)
{
    if (oldName == newName) return;

    ChannelMap::iterator oldChannel = _channels.find (oldName);

    if (oldChannel == _channels.end ())
    {
        THROW (
            ArgExc,
            "Cannot rename image channel " << oldName
                                           << " "
                                              "to "
                                           << newName
                                           << ".  The image does not have "
                                              "a channel called "
                                           << oldName << ".");
    }

    if (_channels.find (newName) != _channels.end ())
    {
        THROW (
            ArgExc,
            "Cannot rename image channel " << oldName
                                           << " "
                                              "to "
                                           << newName
                                           << ".  The image already has "
                                              "a channel called "
                                           << newName << ".");
    }

    try
    {
        for (int y = 0; y < _levels.height (); ++y)
            for (int x = 0; x < _levels.width (); ++x)
                if (_levels[y][x])
                    _levels[y][x]->renameChannel (oldName, newName);

        _channels[newName] = oldChannel->second;
        _channels.erase (oldChannel);
    }
    catch (...)
    {
        eraseChannel (oldName);
        eraseChannel (newName);
        throw;
    }
}